

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O2

void __thiscall CharScanner::CharScanner(CharScanner *this,InputBuffer *cb)

{
  _Rb_tree_header *p_Var1;
  LexerInputState *this_00;
  
  (this->super_TokenStream)._vptr_TokenStream = (_func_int **)&PTR___cxa_pure_virtual_00213770;
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  (this->text)._M_string_length = 0;
  (this->text).field_2._M_local_buf[0] = '\0';
  this->saveConsumedInput = true;
  (this->literals)._M_t._M_impl.super__Rb_tree_key_compare<CharScannerLiteralsLess>._M_key_compare.
  scanner = this;
  (this->literals)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->literals)._M_t._M_impl.super__Rb_tree_header;
  (this->literals)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->literals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->literals)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->literals)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_returnToken).ref = (Ref *)0x0;
  this_00 = (LexerInputState *)operator_new(0x38);
  LexerInputState::LexerInputState(this_00,cb);
  RefCount<LexerInputState>::RefCount(&this->inputState,this_00);
  this->commitToPath = false;
  (*(this->super_TokenStream)._vptr_TokenStream[0x25])(this,CommonToken::factory);
  return;
}

Assistant:

CharScanner::CharScanner(InputBuffer& cb)
	: saveConsumedInput(true) //, caseSensitiveLiterals(true)
	, literals(CharScannerLiteralsLess(this))
	, inputState(new LexerInputState(cb))
	, commitToPath(false)
{
	setTokenObjectFactory(&CommonToken::factory);
}